

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Listen.cpp
# Opt level: O2

int __thiscall RenX_ListenPlugin::think(RenX_ListenPlugin *this)

{
  long *plVar1;
  ushort uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  undefined8 *puVar3;
  undefined8 uVar4;
  pointer *__ptr;
  long *local_28;
  long *local_20;
  
  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Jupiter::Socket::accept();
  if (__args_1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Jupiter::Socket::setBlocking(SUB81(__args_1,0));
    std::make_unique<RenX::Server,Jupiter::Socket,std::__cxx11::string&>
              ((Socket *)&local_28,__args_1);
    puVar3 = (undefined8 *)RenX::Server::getSocketHostname_abi_cxx11_();
    uVar4 = *puVar3;
    uVar2 = RenX::Server::getSocketPort();
    printf("Incoming server connected from %s:%u\r\n",uVar4,(ulong)uVar2);
    plVar1 = local_28;
    puVar3 = (undefined8 *)RenX::Server::getSocketHostname_abi_cxx11_();
    uVar4 = *puVar3;
    uVar2 = RenX::Server::getSocketPort();
    RenX::Server::sendLogChan
              ((char *)plVar1,"Incoming server connected from \x0312%s:%u",uVar4,(ulong)uVar2);
    uVar4 = RenX::getCore();
    local_20 = local_28;
    local_28 = (long *)0x0;
    RenX::Core::addServer(uVar4);
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 0x10))();
    }
    local_20 = (long *)0x0;
    (**(code **)((__args_1->_M_dataplus)._M_p + 0x70))(__args_1);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 0x10))();
    }
  }
  return 0;
}

Assistant:

int RenX_ListenPlugin::think() {
	Jupiter::Socket *sock = socket.accept();
	if (sock != nullptr) {
		sock->setBlocking(false);
		std::unique_ptr<RenX::Server> server = std::make_unique<RenX::Server>(std::move(*sock), RenX_ListenPlugin::serverSection);
		printf("Incoming server connected from %s:%u" ENDL, server->getSocketHostname().c_str(), server->getSocketPort());
		server->sendLogChan("Incoming server connected from " IRCCOLOR "12%s:%u", server->getSocketHostname().c_str(), server->getSocketPort());
		RenX::getCore()->addServer(std::move(server));
		delete sock;
	}
	return 0;
}